

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quick_connection.cc
# Opt level: O3

void __thiscall QuickConnection::ConnectToServer(QuickConnection *this)

{
  QuicClock *pQVar1;
  int iVar2;
  undefined8 in_RAX;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  QuickHello msg;
  undefined8 uStack_18;
  
  pQVar1 = (this->_clock)._M_t.
           super___uniq_ptr_impl<quic::QuicClock,_std::default_delete<quic::QuicClock>_>._M_t.
           super__Tuple_impl<0UL,_quic::QuicClock_*,_std::default_delete<quic::QuicClock>_>.
           super__Head_base<0UL,_quic::QuicClock_*,_false>._M_head_impl;
  if (pQVar1 != (QuicClock *)0x0) {
    uStack_18 = in_RAX;
    iVar2 = (*pQVar1->_vptr_QuicClock[3])();
    this->_reconnect_time = CONCAT44(extraout_var,iVar2);
    uStack_18 = CONCAT44(this->_session_id,CONCAT13(1,(undefined3)uStack_18));
    iVar2 = (*((this->_clock)._M_t.
               super___uniq_ptr_impl<quic::QuicClock,_std::default_delete<quic::QuicClock>_>._M_t.
               super__Tuple_impl<0UL,_quic::QuicClock_*,_std::default_delete<quic::QuicClock>_>.
               super__Head_base<0UL,_quic::QuicClock_*,_false>._M_head_impl)->_vptr_QuicClock[3])();
    this->_latest_send_msg_time = CONCAT44(extraout_var_00,iVar2);
    UdpSocket::Send(this->_socket,&this->_dst_ip,this->_dst_port,(uint8_t *)((long)&uStack_18 + 3),5
                   );
  }
  return;
}

Assistant:

void QuickConnection::ConnectToServer()
{
	if (_clock == nullptr)
		return;
	_reconnect_time = _clock->Now().ToDebuggingValue();
	QuickHello msg;
	msg.session_id = _session_id;
	Send(&msg, sizeof(msg));
}